

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall
QOpenGL2PaintEngineExPrivate::updateCompositionMode(QOpenGL2PaintEngineExPrivate *this)

{
  char cVar1;
  OpenGLFeature OVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = QOpenGLContext::functions();
  cVar1 = QOpenGLFunctions::hasOpenGLFeature(OVar2);
  lVar5 = *(long *)&this->q->field_0x8;
  lVar4 = lVar5 + -8;
  if (lVar5 == 0) {
    lVar4 = 0;
  }
  if (cVar1 == '\0') {
    if (*(int *)(lVar4 + 0x1b4) < 0xd) goto LAB_0013f263;
switchD_0013f28c_default:
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning(local_30,"Unsupported composition mode");
    goto LAB_0013f409;
  }
  if (*(int *)(lVar4 + 0x1b4) < 0xd) {
    (**(code **)(*(long *)&this->funcs + 0x70))(0x9285);
    puVar3 = (undefined8 *)(*(long *)&this->funcs + 0x1b0);
    uVar6 = 0x8006;
  }
  else {
    puVar3 = (undefined8 *)(*(long *)&this->funcs + 0x88);
    uVar6 = 0x9285;
  }
  (*(code *)*puVar3)(uVar6);
  lVar5 = *(long *)&this->q->field_0x8;
  lVar4 = lVar5 + -8;
  if (lVar5 == 0) {
    lVar4 = 0;
  }
  QOpenGLEngineShaderManager::setCompositionMode
            ((QOpenGLEngineShaderManager *)this->shaderManager,*(CompositionMode *)(lVar4 + 0x1b4));
  lVar5 = *(long *)&this->q->field_0x8;
LAB_0013f263:
  lVar4 = lVar5 + -8;
  if (lVar5 == 0) {
    lVar4 = 0;
  }
  switch(*(undefined4 *)(lVar4 + 0x1b4)) {
  case 0:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 1;
    goto LAB_0013f3d1;
  case 1:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 1;
    uVar7 = 0x305;
    goto LAB_0013f3d6;
  case 2:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_0013f37c;
  case 3:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 1;
    goto LAB_0013f37c;
  case 4:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 1;
    uVar7 = 0;
    goto LAB_0013f3d6;
  case 5:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0x304;
    goto LAB_0013f37c;
  case 6:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_0013f3c1;
  case 7:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0x305;
LAB_0013f37c:
    uVar6 = 0;
    goto LAB_0013f3d6;
  case 8:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_0013f3d1;
  case 9:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0x304;
    goto LAB_0013f3d1;
  case 10:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0x305;
LAB_0013f3c1:
    uVar6 = 0x302;
    goto LAB_0013f3d6;
  case 0xb:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 0x305;
LAB_0013f3d1:
    uVar6 = 0x303;
    goto LAB_0013f3d6;
  case 0xc:
    lVar4 = *(long *)&this->funcs;
    uVar7 = 1;
    uVar6 = 1;
LAB_0013f3d6:
    (**(code **)(lVar4 + 8))(uVar7,uVar6);
    goto LAB_0013f409;
  case 0xd:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x9294;
    break;
  case 0xe:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x9295;
    break;
  case 0xf:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x9296;
    break;
  case 0x10:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x9297;
    break;
  case 0x11:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x9298;
    break;
  case 0x12:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x9299;
    break;
  case 0x13:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x929a;
    break;
  case 0x14:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x929b;
    break;
  case 0x15:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x929c;
    break;
  case 0x16:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x929e;
    break;
  case 0x17:
    lVar4 = *(long *)&this->funcs;
    uVar6 = 0x92a0;
    break;
  default:
    goto switchD_0013f28c_default;
  }
  (**(code **)(lVar4 + 0x1b0))(uVar6);
LAB_0013f409:
  this->compositionModeDirty = false;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateCompositionMode()
{
    // NOTE: The entire paint engine works on pre-multiplied data - which is why some of these
    //       composition modes look odd.
//     qDebug() << "QOpenGL2PaintEngineExPrivate::updateCompositionMode() - Setting GL composition mode for " << q->state()->composition_mode;
    if (ctx->functions()->hasOpenGLFeature(QOpenGLFunctions::BlendEquationAdvanced)) {
       if (q->state()->composition_mode <= QPainter::CompositionMode_Plus) {
           funcs.glDisable(GL_BLEND_ADVANCED_COHERENT_KHR);
           funcs.glBlendEquation(GL_FUNC_ADD);
       } else {
           funcs.glEnable(GL_BLEND_ADVANCED_COHERENT_KHR);
       }
       shaderManager->setCompositionMode(q->state()->composition_mode);
    } else {
        if (q->state()->composition_mode > QPainter::CompositionMode_Plus) {
            qWarning("Unsupported composition mode");
            compositionModeDirty = false;
            return;
        }
    }
    switch(q->state()->composition_mode) {
    case QPainter::CompositionMode_SourceOver:
        funcs.glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_DestinationOver:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE);
        break;
    case QPainter::CompositionMode_Clear:
        funcs.glBlendFunc(GL_ZERO, GL_ZERO);
        break;
    case QPainter::CompositionMode_Source:
        funcs.glBlendFunc(GL_ONE, GL_ZERO);
        break;
    case QPainter::CompositionMode_Destination:
        funcs.glBlendFunc(GL_ZERO, GL_ONE);
        break;
    case QPainter::CompositionMode_SourceIn:
        funcs.glBlendFunc(GL_DST_ALPHA, GL_ZERO);
        break;
    case QPainter::CompositionMode_DestinationIn:
        funcs.glBlendFunc(GL_ZERO, GL_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_SourceOut:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ZERO);
        break;
    case QPainter::CompositionMode_DestinationOut:
        funcs.glBlendFunc(GL_ZERO, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_SourceAtop:
        funcs.glBlendFunc(GL_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_DestinationAtop:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_Xor:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_Plus:
        funcs.glBlendFunc(GL_ONE, GL_ONE);
        break;
    case QPainter::CompositionMode_Multiply:
        funcs.glBlendEquation(GL_MULTIPLY_KHR);
        break;
    case QPainter::CompositionMode_Screen:
        funcs.glBlendEquation(GL_SCREEN_KHR);
        break;
    case QPainter::CompositionMode_Overlay:
        funcs.glBlendEquation(GL_OVERLAY_KHR);
        break;
    case QPainter::CompositionMode_Darken:
        funcs.glBlendEquation(GL_DARKEN_KHR);
        break;
    case QPainter::CompositionMode_Lighten:
        funcs.glBlendEquation(GL_LIGHTEN_KHR);
        break;
    case QPainter::CompositionMode_ColorDodge:
        funcs.glBlendEquation(GL_COLORDODGE_KHR);
        break;
    case QPainter::CompositionMode_ColorBurn:
        funcs.glBlendEquation(GL_COLORBURN_KHR);
        break;
    case QPainter::CompositionMode_HardLight:
        funcs.glBlendEquation(GL_HARDLIGHT_KHR);
        break;
    case QPainter::CompositionMode_SoftLight:
        funcs.glBlendEquation(GL_SOFTLIGHT_KHR);
        break;
    case QPainter::CompositionMode_Difference:
        funcs.glBlendEquation(GL_DIFFERENCE_KHR);
        break;
    case QPainter::CompositionMode_Exclusion:
        funcs.glBlendEquation(GL_EXCLUSION_KHR);
        break;
    default:
        qWarning("Unsupported composition mode");
        break;
    }

    compositionModeDirty = false;
}